

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynReturn * ParseReturn(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynBase *value_00;
  Lexeme *end;
  SynBase *value;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_return);
  if (bVar1) {
    value_00 = ParseAssignment(ctx);
    anon_unknown.dwarf_11716f::CheckConsume
              (ctx,lex_semicolon,
               "ERROR: return statement must be followed by an expression or \';\'");
    ctx_local = (ParseContext *)ParseContext::get<SynReturn>(ctx);
    end = ParseContext::Previous(ctx);
    SynReturn::SynReturn((SynReturn *)ctx_local,begin,end,value_00);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynReturn *)ctx_local;
}

Assistant:

SynReturn* ParseReturn(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_return))
	{
		// Optional
		SynBase *value = ParseAssignment(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: return statement must be followed by an expression or ';'");

		return new (ctx.get<SynReturn>()) SynReturn(start, ctx.Previous(), value);
	}

	return NULL;
}